

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBinPacker.cxx
# Opt level: O2

bool cmAllocateCTestResourcesRoundRobin
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>
                *resources,
               vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>
               *allocations)

{
  pointer pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer ppcVar4;
  pointer ppcVar5;
  bool bVar6;
  _Base_ptr p_Var7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>
  *__range2;
  cmCTestBinPackerAllocation *allocation;
  pointer pcVar8;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_90;
  _TmpBuf __buf;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resourcesSorted;
  vector<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_> allocationsPtr
  ;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_30;
  
  allocationsPtr.
  super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allocationsPtr.
  super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  allocationsPtr.
  super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>::reserve
            (&allocationsPtr,
             ((long)(allocations->
                    super__Vector_base<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(allocations->
                   super__Vector_base<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x30);
  pcVar1 = (allocations->
           super__Vector_base<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pcVar8 = (allocations->
                super__Vector_base<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppcVar5 = allocationsPtr.
                super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      ppcVar4 = allocationsPtr.
                super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
                ._M_impl.super__Vector_impl_data._M_start, pcVar8 != pcVar1; pcVar8 = pcVar8 + 1) {
    __buf._M_original_len = (size_type_conflict)pcVar8;
    std::vector<cmCTestBinPackerAllocation*,std::allocator<cmCTestBinPackerAllocation*>>::
    emplace_back<cmCTestBinPackerAllocation*>
              ((vector<cmCTestBinPackerAllocation*,std::allocator<cmCTestBinPackerAllocation*>> *)
               &allocationsPtr,(cmCTestBinPackerAllocation **)&__buf);
  }
  if ((long)allocationsPtr.
            super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)allocationsPtr.
            super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    resourcesSorted.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)allocationsPtr.
                  super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    std::
    _Temporary_buffer<std::reverse_iterator<__gnu_cxx::__normal_iterator<cmCTestBinPackerAllocation_**,_std::vector<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>_>_>,_cmCTestBinPackerAllocation_*>
    ::_Temporary_buffer(&__buf,(reverse_iterator<__gnu_cxx::__normal_iterator<cmCTestBinPackerAllocation_**,_std::vector<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>_>_>
                                *)&resourcesSorted,
                        (((long)allocationsPtr.
                                super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)allocationsPtr.
                                super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) + 1) / 2);
    if (__buf._M_buffer == (pointer)0x0) {
      local_70.current._M_current =
           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )ppcVar5;
      local_90.current._M_current =
           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )ppcVar4;
      std::
      __inplace_stable_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<cmCTestBinPackerAllocation**,std::vector<cmCTestBinPackerAllocation*,std::allocator<cmCTestBinPackerAllocation*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::AllocateCTestResources<(anonymous_namespace)::RoundRobinAllocationStrategy>(std::map<std::__cxx11::string,cmCTestResourceAllocator::Resource,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCTestResourceAllocator::Resource>>>const&,std::vector<cmCTestBinPackerAllocation,std::allocator<cmCTestBinPackerAllocation>>&)::_lambda(cmCTestBinPackerAllocation*,cmCTestBinPackerAllocation*)_1_>>
                ();
    }
    else {
      local_70.current._M_current =
           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )ppcVar5;
      local_90.current._M_current =
           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )ppcVar4;
      std::
      __stable_sort_adaptive<std::reverse_iterator<__gnu_cxx::__normal_iterator<cmCTestBinPackerAllocation**,std::vector<cmCTestBinPackerAllocation*,std::allocator<cmCTestBinPackerAllocation*>>>>,cmCTestBinPackerAllocation**,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::AllocateCTestResources<(anonymous_namespace)::RoundRobinAllocationStrategy>(std::map<std::__cxx11::string,cmCTestResourceAllocator::Resource,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCTestResourceAllocator::Resource>>>const&,std::vector<cmCTestBinPackerAllocation,std::allocator<cmCTestBinPackerAllocation>>&)::_lambda(cmCTestBinPackerAllocation*,cmCTestBinPackerAllocation*)_1_>>
                ();
    }
    std::
    _Temporary_buffer<std::reverse_iterator<__gnu_cxx::__normal_iterator<cmCTestBinPackerAllocation_**,_std::vector<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>_>_>,_cmCTestBinPackerAllocation_*>
    ::~_Temporary_buffer(&__buf);
  }
  resourcesSorted.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  resourcesSorted.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  resourcesSorted.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&resourcesSorted,(resources->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var7 = (resources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      pbVar3 = resourcesSorted.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      pbVar2 = resourcesSorted.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      (_Rb_tree_header *)p_Var7 != &(resources->_M_t)._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&resourcesSorted,(value_type *)(p_Var7 + 1));
  }
  if ((long)resourcesSorted.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)resourcesSorted.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    local_70.current._M_current =
         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )resourcesSorted.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::
    _Temporary_buffer<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Temporary_buffer((_Temporary_buffer<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&__buf,&local_70,
                        (((long)resourcesSorted.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)resourcesSorted.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) + 1) / 2);
    if (__buf._M_buffer == (pointer)0x0) {
      local_90.current._M_current =
           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar3;
      local_30.current._M_current =
           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar2;
      std::
      __inplace_stable_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RoundRobinAllocationStrategy::InitialSort(std::map<std::__cxx11::string,cmCTestResourceAllocator::Resource,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCTestResourceAllocator::Resource>>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>>
                (&local_90,&local_30,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_CTest_cmCTestBinPacker_cxx:132:5)>
                  )resources);
    }
    else {
      local_90.current._M_current =
           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar3;
      local_30.current._M_current =
           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar2;
      std::
      __stable_sort_adaptive<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__cxx11::string*,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RoundRobinAllocationStrategy::InitialSort(std::map<std::__cxx11::string,cmCTestResourceAllocator::Resource,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCTestResourceAllocator::Resource>>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>>
                (&local_90,&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __buf._M_buffer,__buf._M_len,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_CTest_cmCTestBinPacker_cxx:132:5)>
                  )resources);
    }
    std::
    _Temporary_buffer<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Temporary_buffer
              ((_Temporary_buffer<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__buf);
  }
  bVar6 = anon_unknown.dwarf_452862::
          AllocateCTestResources<(anonymous_namespace)::RoundRobinAllocationStrategy>
                    (resources,&resourcesSorted,0,&allocationsPtr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&resourcesSorted);
  std::_Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>::
  ~_Vector_base(&allocationsPtr.
                 super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
               );
  return bVar6;
}

Assistant:

bool cmAllocateCTestResourcesRoundRobin(
  const std::map<std::string, cmCTestResourceAllocator::Resource>& resources,
  std::vector<cmCTestBinPackerAllocation>& allocations)
{
  return AllocateCTestResources<RoundRobinAllocationStrategy>(resources,
                                                              allocations);
}